

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void av1_fwd_txfm2d_8x8_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  int8_t *piVar2;
  undefined7 in_register_00000009;
  int iVar3;
  int iVar4;
  __m256i out [8];
  __m256i in [8];
  longlong local_260 [32];
  longlong local_160 [38];
  
  piVar2 = av1_fwd_txfm_shift_ls[1];
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    fdct8_avx2((__m256i *)local_160,(__m256i *)local_260,'\r',1,1);
    goto LAB_003e061a;
  case 1:
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    fadst8_avx2((__m256i *)local_160,(__m256i *)local_260,'\r',1,1);
LAB_003e061a:
    col_txfm_8x8_rounding((__m256i *)local_260,-(int)piVar2[1]);
    fwd_txfm_transpose_8x8_avx2((__m256i *)local_260,(__m256i *)local_160,1,1);
    goto LAB_003e0650;
  case 2:
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    fdct8_avx2((__m256i *)local_160,(__m256i *)local_260,'\r',1,1);
    goto LAB_003e0587;
  case 3:
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    fadst8_avx2((__m256i *)local_160,(__m256i *)local_260,'\r',1,1);
LAB_003e0587:
    col_txfm_8x8_rounding((__m256i *)local_260,-(int)piVar2[1]);
    fwd_txfm_transpose_8x8_avx2((__m256i *)local_260,(__m256i *)local_160,1,1);
    break;
  case 4:
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,1,0,(int)*av1_fwd_txfm_shift_ls[1]);
    fadst8_avx2((__m256i *)local_160,(__m256i *)local_260,'\r',1,1);
    col_txfm_8x8_rounding((__m256i *)local_260,-(int)piVar2[1]);
    fwd_txfm_transpose_8x8_avx2((__m256i *)local_260,(__m256i *)local_160,1,1);
    goto LAB_003e0650;
  case 5:
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,0,1,(int)*av1_fwd_txfm_shift_ls[1]);
    fdct8_avx2((__m256i *)local_160,(__m256i *)local_260,'\r',1,1);
    goto LAB_003e07e4;
  case 6:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 1;
    goto LAB_003e072e;
  case 7:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 0;
LAB_003e072e:
    iVar4 = 1;
LAB_003e07be:
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,iVar3,iVar4,(int)cVar1);
    fadst8_avx2((__m256i *)local_160,(__m256i *)local_260,'\r',1,1);
LAB_003e07e4:
    col_txfm_8x8_rounding((__m256i *)local_260,-(int)piVar2[1]);
    fwd_txfm_transpose_8x8_avx2((__m256i *)local_260,(__m256i *)local_160,1,1);
    break;
  case 8:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 1;
    iVar4 = 0;
    goto LAB_003e07be;
  case 9:
    iVar3 = 0;
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    idtx8_avx2((__m256i *)local_160,(__m256i *)local_260,'\0',1,iVar3);
    goto LAB_003e0774;
  case 10:
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    iVar3 = 1;
    fdct8_avx2((__m256i *)local_160,(__m256i *)local_260,'\r',1,1);
    goto LAB_003e0774;
  case 0xb:
    iVar3 = 0;
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    idtx8_avx2((__m256i *)local_160,(__m256i *)local_260,'\0',1,iVar3);
    col_txfm_8x8_rounding((__m256i *)local_260,-(int)piVar2[1]);
    fwd_txfm_transpose_8x8_avx2((__m256i *)local_260,(__m256i *)local_160,1,1);
LAB_003e0650:
    iVar4 = 1;
    fdct8_avx2((__m256i *)local_160,(__m256i *)local_260,'\r',1,1);
    goto LAB_003e081f;
  case 0xc:
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    iVar3 = 1;
    fadst8_avx2((__m256i *)local_160,(__m256i *)local_260,'\r',1,1);
LAB_003e0774:
    col_txfm_8x8_rounding((__m256i *)local_260,-(int)piVar2[1]);
    fwd_txfm_transpose_8x8_avx2((__m256i *)local_260,(__m256i *)local_160,1,1);
LAB_003e079e:
    iVar4 = 1;
    idtx8_avx2((__m256i *)local_160,(__m256i *)local_260,'\0',1,iVar3);
    goto LAB_003e081f;
  case 0xd:
    iVar3 = 0;
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    idtx8_avx2((__m256i *)local_160,(__m256i *)local_260,'\0',1,iVar3);
    col_txfm_8x8_rounding((__m256i *)local_260,-(int)piVar2[1]);
    fwd_txfm_transpose_8x8_avx2((__m256i *)local_260,(__m256i *)local_160,1,1);
    break;
  case 0xe:
    iVar3 = 1;
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,1,0,(int)*av1_fwd_txfm_shift_ls[1]);
    fadst8_avx2((__m256i *)local_160,(__m256i *)local_260,'\r',1,1);
    col_txfm_8x8_rounding((__m256i *)local_260,-(int)piVar2[1]);
    fwd_txfm_transpose_8x8_avx2((__m256i *)local_260,(__m256i *)local_160,1,1);
    goto LAB_003e079e;
  case 0xf:
    iVar3 = 1;
    load_buffer_8x8_avx2(input,(__m256i *)local_160,stride,0,1,(int)*av1_fwd_txfm_shift_ls[1]);
    idtx8_avx2((__m256i *)local_160,(__m256i *)local_260,'\0',1,iVar3);
    col_txfm_8x8_rounding((__m256i *)local_260,-(int)piVar2[1]);
    fwd_txfm_transpose_8x8_avx2((__m256i *)local_260,(__m256i *)local_160,1,1);
    break;
  default:
    goto switchD_003e026f_default;
  }
  iVar4 = 1;
  fadst8_avx2((__m256i *)local_160,(__m256i *)local_260,'\r',1,1);
LAB_003e081f:
  store_buffer_avx2((__m256i *)local_260,coeff,8,iVar4);
switchD_003e026f_default:
  return;
}

Assistant:

void av1_fwd_txfm2d_8x8_avx2(const int16_t *input, int32_t *coeff, int stride,
                             TX_TYPE tx_type, int bd) {
  __m256i in[8], out[8];
  const TX_SIZE tx_size = TX_8X8;
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int width = tx_size_wide[tx_size];
  const int width_div8 = (width >> 3);

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fdct8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case ADST_DCT:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fdct8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case DCT_ADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case ADST_ADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case FLIPADST_DCT:
      load_buffer_8x8_avx2(input, in, stride, 1, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fdct8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case DCT_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 1, shift[0]);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 1, 1, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case ADST_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 1, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case FLIPADST_ADST:
      load_buffer_8x8_avx2(input, in, stride, 1, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case IDTX:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case V_DCT:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case H_DCT:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case V_ADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case H_ADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case V_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 1, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case H_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 1, shift[0]);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    default: assert(0);
  }
  (void)bd;
}